

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcConstructionResource.field_0x68 = 0x903580;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x50 = 0x903670;
  *(undefined8 *)
   &this[-1].super_IfcConstructionResource.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>.field_0x10 = 0x9035a8;
  *(undefined8 *)
   &this[-1].super_IfcConstructionResource.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>.field_0x20 = 0x9035d0;
  *(undefined8 *)&this[-1].super_IfcConstructionResource.ResourceGroup.have = 0x9035f8;
  this[-1].super_IfcConstructionResource.ResourceConsumption.ptr._M_string_length = 0x903620;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x903648;
  puVar1 = *(undefined1 **)&(this->super_IfcConstructionResource).field_0x28;
  if (puVar1 != &(this->super_IfcConstructionResource).field_0x38) {
    operator_delete(puVar1);
  }
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             &(this->super_IfcConstructionResource).field_0x18;
  puVar1 = &this[-1].super_IfcConstructionResource.field_0x68;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  IfcConstructionResource::~IfcConstructionResource
            ((IfcConstructionResource *)puVar1,&PTR_construction_vtable_24__00903688);
  operator_delete(puVar1);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}